

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O1

ref<immutable::rrb<int,_false,_6>_> __thiscall
immutable::transient_to_rrb<int,false,6>
          (immutable *this,ref<immutable::transient_rrb<int,_false,_6>_> *trrb)

{
  size_t __size;
  uint uVar1;
  uint32_t uVar2;
  transient_rrb<int,_false,_6> *ptVar3;
  leaf_node<int,_false> *plVar4;
  int *piVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  tree_node<int,_false> *ptVar8;
  rrb<int,_false,_6> *prVar9;
  leaf_node<int,_false> *__s;
  undefined8 *puVar10;
  ulong uVar11;
  ref<immutable::rrb_details::leaf_node<int,_false>_> leaf;
  ref<immutable::rrb<int,_false,_6>_> *out;
  ref<immutable::rrb_details::leaf_node<int,_false>_> local_48;
  ref<immutable::transient_rrb<int,_false,_6>_> *local_40;
  rrb<int,_false,_6> *local_38;
  
  ptVar3 = trrb->ptr;
  local_40 = trrb;
  local_38 = (rrb<int,_false,_6> *)this;
  if (ptVar3 != (transient_rrb<int,_false,_6> *)0x0) {
    ptVar3->guid = 0;
    plVar4 = (ptVar3->tail).ptr;
    uVar1 = plVar4->len;
    __size = (ulong)uVar1 * 4 + 0x18;
    __s = (leaf_node<int,_false> *)malloc(__size);
    memset(__s,0,__size);
    __s->len = uVar1;
    __s->type = LEAF_NODE;
    __s->child = (int *)(__s + 1);
    __s->guid = 0;
    uVar1 = plVar4->len;
    if ((ulong)uVar1 != 0) {
      piVar5 = plVar4->child;
      uVar11 = 0;
      do {
        (&__s[1].type)[uVar11] = piVar5[uVar11];
        uVar11 = uVar11 + 1;
      } while (uVar1 != uVar11);
    }
    __s->_ref_count = 1;
    local_48.ptr = __s;
    ref<immutable::rrb_details::leaf_node<int,_false>_>::operator=(&ptVar3->tail,&local_48);
    ptVar3 = local_40->ptr;
    puVar10 = (undefined8 *)malloc(0x28);
    prVar9 = local_38;
    uVar6 = *(undefined8 *)ptVar3;
    uVar7 = *(undefined8 *)&ptVar3->tail_len;
    ptVar8 = (ptVar3->root).ptr;
    puVar10[2] = (ptVar3->tail).ptr;
    puVar10[3] = ptVar8;
    *puVar10 = uVar6;
    puVar10[1] = uVar7;
    puVar10[4] = *(undefined8 *)&ptVar3->_ref_count;
    if (puVar10[3] != 0) {
      piVar5 = (int *)(puVar10[3] + 8);
      *piVar5 = *piVar5 + 1;
    }
    if (puVar10[2] != 0) {
      piVar5 = (int *)(puVar10[2] + 8);
      *piVar5 = *piVar5 + 1;
    }
    *(undefined8 **)local_38 = puVar10;
    if (puVar10 != (undefined8 *)0x0) {
      *(undefined4 *)(puVar10 + 4) = 1;
    }
    if ((local_48.ptr != (leaf_node<int,_false> *)0x0) &&
       (uVar2 = (local_48.ptr)->_ref_count, (local_48.ptr)->_ref_count = uVar2 - 1, uVar2 == 1)) {
      free(local_48.ptr);
    }
    return (ref<immutable::rrb<int,_false,_6>_>)prVar9;
  }
  __assert_fail("ptr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                ,0x71a,
                "T *immutable::ref<immutable::transient_rrb<int, false, 6>>::operator->() const [T = immutable::transient_rrb<int, false, 6>]"
               );
}

Assistant:

inline ref<rrb<T, atomic_ref_counting, N>> transient_to_rrb(const ref<transient_rrb<T, atomic_ref_counting, N>>& trrb)
    {
    using namespace rrb_details;
    trrb->guid = 0;
    ref<leaf_node<T, atomic_ref_counting>> leaf = leaf_node_clone<T, atomic_ref_counting>(trrb->tail.ptr);
    trrb->tail = leaf;
    ref<rrb<T, atomic_ref_counting, N>> out = rrb_head_clone((const rrb<T, atomic_ref_counting, N>*)trrb.ptr);
    return out;
    }